

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::anon_unknown_23::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocateArray<google::protobuf::FieldDescriptor>
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,int array_size)

{
  int iVar1;
  uint uVar2;
  PointerT<char> pcVar3;
  long lVar4;
  FieldDescriptor *extraout_RAX;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *proto;
  FieldDescriptor *pFVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *proto_01;
  uint in_ECX;
  long extraout_RDX;
  long lVar6;
  undefined4 in_register_00000034;
  ulong uVar7;
  DescriptorBuilder *this_00;
  long lVar8;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  local_10 [16];
  
  uVar7 = CONCAT44(in_register_00000034,array_size);
  pcVar3 = (this->pointers_).payload_.super_Base<char>.value;
  if (pcVar3 == (PointerT<char>)0x0) {
    (anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::AllocateArray<google::protobuf::FieldDescriptor>(local_10);
  }
  else {
    iVar1 = (this->used_).payload_.super_Base<char>.value;
    in_ECX = array_size * 0x58 + iVar1;
    (this->used_).payload_.super_Base<char>.value = in_ECX;
    uVar2 = (this->total_).payload_.super_Base<char>.value;
    uVar7 = (ulong)uVar2;
    if ((int)in_ECX <= (int)uVar2) {
      return (FieldDescriptor *)(pcVar3 + iVar1);
    }
  }
  this_00 = (DescriptorBuilder *)(ulong)in_ECX;
  (anonymous_namespace)::
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  ::AllocateArray<google::protobuf::FieldDescriptor>();
  pFVar5 = extraout_RAX;
  if (0 < *(int *)(uVar7 + 0x3c)) {
    lVar6 = 0;
    lVar8 = 0;
    do {
      lVar4 = *(long *)(uVar7 + 0x60);
      proto = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                        ((RepeatedPtrFieldBase *)(extraout_RDX + 0x30),(int)lVar8);
      DescriptorBuilder::CrossLinkMessage(this_00,(Descriptor *)(lVar4 + lVar6),proto);
      lVar8 = lVar8 + 1;
      pFVar5 = (FieldDescriptor *)(long)*(int *)(uVar7 + 0x3c);
      lVar6 = lVar6 + 0x98;
    } while (lVar8 < (long)pFVar5);
  }
  if (0 < *(int *)(uVar7 + 4)) {
    lVar6 = 0;
    lVar8 = 0;
    do {
      lVar4 = *(long *)(uVar7 + 0x78);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                           ((RepeatedPtrFieldBase *)(extraout_RDX + 0x78),(int)lVar8);
      DescriptorBuilder::CrossLinkField(this_00,(FieldDescriptor *)(lVar4 + lVar6),proto_00);
      lVar8 = lVar8 + 1;
      pFVar5 = (FieldDescriptor *)(long)*(int *)(uVar7 + 4);
      lVar6 = lVar6 + 0x58;
    } while (lVar8 < (long)pFVar5);
  }
  if (0 < *(int *)(uVar7 + 0x44)) {
    lVar6 = 0;
    lVar8 = 0;
    do {
      lVar4 = *(long *)(uVar7 + 0x70);
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                           ((RepeatedPtrFieldBase *)(extraout_RDX + 0x60),(int)lVar8);
      DescriptorBuilder::CrossLinkService(this_00,(ServiceDescriptor *)(lVar4 + lVar6),proto_01);
      lVar8 = lVar8 + 1;
      pFVar5 = (FieldDescriptor *)(long)*(int *)(uVar7 + 0x44);
      lVar6 = lVar6 + 0x40;
    } while (lVar8 < (long)pFVar5);
  }
  return pFVar5;
}

Assistant:

U* AllocateArray(int array_size) {
    constexpr bool trivial = std::is_trivially_destructible<U>::value;
    using TypeToUse = typename std::conditional<trivial, char, U>::type;

    // We can only allocate after FinalizePlanning has been called.
    ABSL_CHECK(has_allocated());

    TypeToUse*& data = pointers_.template Get<TypeToUse>();
    int& used = used_.template Get<TypeToUse>();
    U* res = reinterpret_cast<U*>(data + used);
    used += trivial ? RoundUpTo<8>(array_size * sizeof(U)) : array_size;
    ABSL_CHECK_LE(used, total_.template Get<TypeToUse>());
    return res;
  }